

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

bool GEO::String::to_bool(string *s)

{
  ConversionError *this;
  bool bVar1;
  bool value;
  allocator local_39;
  string local_38;
  
  bVar1 = from_string<bool>(s,&value);
  if (bVar1) {
    return value;
  }
  this = (ConversionError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_38,"boolean",&local_39);
  ConversionError::ConversionError(this,s,&local_38);
  __cxa_throw(this,&ConversionError::typeinfo,std::logic_error::~logic_error);
}

Assistant:

inline bool to_bool(const std::string& s) {
            bool value;
            if(!from_string(s, value)) {
                throw ConversionError(s, "boolean");
            }
            return value;
        }